

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O3

void __thiscall
stateObservation::LipmDcmEstimator::setUnbiasedDCM
          (LipmDcmEstimator *this,Vector2 *dcm,Vector2 *uncertainty)

{
  DenseStorage<double,__1,__1,__1,_0> local_68;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  setUnbiasedDCM(this,dcm);
  KalmanFilterBase::getStateCovariance((Pmatrix *)&local_68,&(this->filter_).super_KalmanFilterBase)
  ;
  if ((local_68.m_rows != 4) || (local_68.m_cols != 4)) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 4, 4>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 4, 4>]"
                 );
  }
  local_38 = local_68.m_data[10];
  dStack_30 = local_68.m_data[0xb];
  local_28 = local_68.m_data[0xe];
  dStack_20 = local_68.m_data[0xf];
  free(local_68.m_data);
  local_48 = (uncertainty->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
             m_data.array[0];
  dStack_40 = (uncertainty->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[1];
  local_68.m_data = (double *)0x0;
  local_68.m_rows = 0;
  local_68.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_68,0x10,4,4);
  if ((local_68.m_rows != 4) || (local_68.m_cols != 4)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_68,0x10,4,4);
    if ((local_68.m_rows != 4) || (local_68.m_cols != 4)) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 4, 4>, T1 = double, T2 = double]"
                   );
    }
  }
  *local_68.m_data = local_48 * local_48;
  local_68.m_data[1] = 0.0;
  *(undefined1 (*) [16])(local_68.m_data + 2) = (undefined1  [16])0x0;
  local_68.m_data[4] = 0.0;
  local_68.m_data[5] = dStack_40 * dStack_40;
  *(undefined1 (*) [16])(local_68.m_data + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(local_68.m_data + 8) = (undefined1  [16])0x0;
  local_68.m_data[10] = local_38;
  local_68.m_data[0xb] = dStack_30;
  *(undefined1 (*) [16])(local_68.m_data + 0xc) = (undefined1  [16])0x0;
  local_68.m_data[0xe] = local_28;
  local_68.m_data[0xf] = dStack_20;
  KalmanFilterBase::setStateCovariance(&(this->filter_).super_KalmanFilterBase,(Pmatrix *)&local_68)
  ;
  free(local_68.m_data);
  return;
}

Assistant:

void LipmDcmEstimator::setUnbiasedDCM(const Vector2 & dcm, const Vector2 & uncertainty)
{
  setUnbiasedDCM(dcm);
  Matrix4 P = filter_.getStateCovariance();
  /// resetting the non diagonal parts
  P.topRightCorner<2, 2>().setZero();
  P.bottomLeftCorner<2, 2>().setZero();
  P.topLeftCorner<2, 2>() = Vec2ToSqDiag_(uncertainty);
  filter_.setStateCovariance(P);
}